

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effective_info.c
# Opt level: O2

double sum_row(double *row,size_t n)

{
  size_t i;
  size_t sVar1;
  double dVar2;
  
  sVar1 = 0;
  dVar2 = 0.0;
  while( true ) {
    if (n == sVar1) {
      return dVar2;
    }
    if (row[sVar1] < 0.0) break;
    dVar2 = dVar2 + row[sVar1];
    sVar1 = sVar1 + 1;
  }
  return NAN;
}

Assistant:

static inline double sum_row(double const *row, size_t n)
{
    double sum = 0.0;
    for (size_t i = 0; i < n; ++i)
    {
        if (row[i] < 0.0)
            return NAN;
        sum += row[i];
    }
    return sum;
}